

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O1

int Dar_ManRefactorTryCuts(Ref_Man_t *p,Aig_Obj_t *pObj,int nNodesSaved,int Required)

{
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Vec_t *pVVar5;
  uint *puTruth;
  ulong uVar6;
  Kit_Graph_t *pKVar8;
  void **ppvVar9;
  long lVar10;
  long lVar11;
  ulong uVar7;
  
  p->GainBest = -1;
  p->pGraphBest = (Kit_Graph_t *)0x0;
  pVVar5 = p->vCuts;
  if (0 < pVVar5->nSize) {
    lVar11 = 0;
    do {
      vLeaves = (Vec_Ptr_t *)pVVar5->pArray[lVar11];
      if (vLeaves->nSize == 0) goto LAB_0048f9c1;
      p->nCutsTried = p->nCutsTried + 1;
      Aig_ObjCollectCut(pObj,vLeaves,p->vCutNodes);
      puTruth = Aig_ManCutTruth(pObj,vLeaves,p->vCutNodes,p->vTruthElem,p->vTruthStore);
      iVar3 = vLeaves->nSize;
      uVar6 = (ulong)(uint)(1 << ((char)iVar3 - 5U & 0x1f));
      uVar7 = uVar6;
      if (iVar3 < 6) {
        uVar6 = 1;
        uVar7 = uVar6;
      }
      do {
        iVar2 = (int)uVar6;
        if (iVar2 < 1) goto LAB_0048f9da;
        lVar10 = uVar6 - 1;
        uVar6 = uVar6 - 1;
      } while (puTruth[lVar10] == 0);
      if (iVar2 < 1) {
LAB_0048f9da:
        iVar3 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
        p->GainBest = iVar3;
        pKVar8 = Kit_GraphCreateConst0();
LAB_0048fa10:
        p->pGraphBest = pKVar8;
        pVVar1 = p->vLeavesBest;
        pVVar1->nSize = 0;
        iVar3 = vLeaves->nSize;
        if (pVVar1->nCap < iVar3) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((long)iVar3 << 3);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar1->pArray,(long)iVar3 << 3);
          }
          pVVar1->pArray = ppvVar9;
          pVVar1->nCap = iVar3;
        }
        memcpy(pVVar1->pArray,vLeaves->pArray,(long)vLeaves->nSize << 3);
        pVVar1->nSize = vLeaves->nSize;
        break;
      }
      do {
        iVar2 = (int)uVar7;
        if (iVar2 < 1) goto LAB_0048f9f6;
        lVar10 = uVar7 - 1;
        uVar7 = uVar7 - 1;
      } while (puTruth[lVar10] == 0xffffffff);
      if (iVar2 < 1) {
LAB_0048f9f6:
        iVar3 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
        p->GainBest = iVar3;
        pKVar8 = Kit_GraphCreateConst1();
        goto LAB_0048fa10;
      }
      iVar3 = Kit_TruthIsop(puTruth,iVar3,p->vMemory,0);
      if (-1 < iVar3) {
        pKVar8 = Kit_SopFactor(p->vMemory,0,vLeaves->nSize,p->vMemory);
        iVar3 = Dar_RefactTryGraph(p->pAig,pObj,vLeaves,pKVar8,
                                   nNodesSaved - (uint)(p->pPars->fUseZeros == 0),Required);
        if (-1 < iVar3) {
          iVar3 = nNodesSaved - iVar3;
          if ((p->GainBest < iVar3) ||
             ((p->GainBest == iVar3 &&
              ((pKVar8->fConst != 0 ||
               ((*(uint *)&pKVar8->pNodes[(uint)pKVar8->eRoot >> 1 & 0x3fffffff].field_0x10 & 0x3fff
                ) < (*(uint *)&p->pGraphBest->pNodes[(uint)p->pGraphBest->eRoot >> 1 & 0x3fffffff].
                               field_0x10 & 0x3fff))))))) {
            p->GainBest = iVar3;
            if (p->pGraphBest != (Kit_Graph_t *)0x0) {
              Kit_GraphFree(p->pGraphBest);
            }
            p->pGraphBest = pKVar8;
            pVVar1 = p->vLeavesBest;
            pVVar1->nSize = 0;
            iVar3 = vLeaves->nSize;
            if (pVVar1->nCap < iVar3) {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((long)iVar3 << 3);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar1->pArray,(long)iVar3 << 3);
              }
              pVVar1->pArray = ppvVar9;
              pVVar1->nCap = iVar3;
            }
            memcpy(pVVar1->pArray,vLeaves->pArray,(long)vLeaves->nSize << 3);
            pVVar1->nSize = vLeaves->nSize;
            goto LAB_0048f858;
          }
        }
        Kit_GraphFree(pKVar8);
      }
LAB_0048f858:
      uVar4 = 1 << ((char)vLeaves->nSize - 5U & 0x1f);
      if (vLeaves->nSize < 6) {
        uVar4 = 1;
      }
      if (0 < (int)uVar4) {
        lVar10 = (ulong)uVar4 + 1;
        do {
          puTruth[lVar10 + -2] = ~puTruth[lVar10 + -2];
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
      }
      iVar3 = Kit_TruthIsop(puTruth,vLeaves->nSize,p->vMemory,0);
      if (-1 < iVar3) {
        pKVar8 = Kit_SopFactor(p->vMemory,1,vLeaves->nSize,p->vMemory);
        iVar3 = Dar_RefactTryGraph(p->pAig,pObj,vLeaves,pKVar8,
                                   nNodesSaved - (uint)(p->pPars->fUseZeros == 0),Required);
        if (-1 < iVar3) {
          iVar3 = nNodesSaved - iVar3;
          if ((p->GainBest < iVar3) ||
             ((p->GainBest == iVar3 &&
              ((pKVar8->fConst != 0 ||
               ((*(uint *)&pKVar8->pNodes[(uint)pKVar8->eRoot >> 1 & 0x3fffffff].field_0x10 & 0x3fff
                ) < (*(uint *)&p->pGraphBest->pNodes[(uint)p->pGraphBest->eRoot >> 1 & 0x3fffffff].
                               field_0x10 & 0x3fff))))))) {
            p->GainBest = iVar3;
            if (p->pGraphBest != (Kit_Graph_t *)0x0) {
              Kit_GraphFree(p->pGraphBest);
            }
            p->pGraphBest = pKVar8;
            pVVar1 = p->vLeavesBest;
            pVVar1->nSize = 0;
            iVar3 = vLeaves->nSize;
            if (pVVar1->nCap < iVar3) {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((long)iVar3 << 3);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar1->pArray,(long)iVar3 << 3);
              }
              pVVar1->pArray = ppvVar9;
              pVVar1->nCap = iVar3;
            }
            memcpy(pVVar1->pArray,vLeaves->pArray,(long)vLeaves->nSize << 3);
            pVVar1->nSize = vLeaves->nSize;
            goto LAB_0048f9c1;
          }
        }
        Kit_GraphFree(pKVar8);
      }
LAB_0048f9c1:
      lVar11 = lVar11 + 1;
      pVVar5 = p->vCuts;
    } while (lVar11 < pVVar5->nSize);
  }
  return p->GainBest;
}

Assistant:

int Dar_ManRefactorTryCuts( Ref_Man_t * p, Aig_Obj_t * pObj, int nNodesSaved, int Required )
{
    Vec_Ptr_t * vCut;
    Kit_Graph_t * pGraphCur;
    int k, RetValue, GainCur, nNodesAdded;
    unsigned * pTruth;

    p->GainBest = -1;
    p->pGraphBest = NULL;
    Vec_VecForEachLevel( p->vCuts, vCut, k )
    {
        if ( Vec_PtrSize(vCut) == 0 )
            continue;
//        if ( Vec_PtrSize(vCut) != 0 && Vec_PtrSize(Vec_VecEntry(p->vCuts, k+1)) != 0 )
//            continue;

        p->nCutsTried++;
        // get the cut nodes
        Aig_ObjCollectCut( pObj, vCut, p->vCutNodes );
        // get the truth table
        pTruth = Aig_ManCutTruth( pObj, vCut, p->vCutNodes, p->vTruthElem, p->vTruthStore );
        if ( Kit_TruthIsConst0(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst0();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }
        if ( Kit_TruthIsConst1(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst1();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }

        // try the positive phase
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 0, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
        // try negative phase
        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
//        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 1, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
    }

    return p->GainBest;
}